

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLSurface
eglu::createPixmapSurface
          (NativeDisplay *nativeDisplay,NativePixmap *pixmap,EGLDisplay display,EGLConfig config,
          EGLAttrib *attribList)

{
  int iVar1;
  Capability CVar2;
  deBool dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  InternalError *pIVar5;
  char *__s;
  undefined8 uVar6;
  const_reference pvVar7;
  TestError *pTVar8;
  Library *egl_00;
  bool bVar9;
  bool bVar10;
  bool local_12a;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> legacyAttribs_1;
  vector<int,_std::allocator<int>_> legacyAttribs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  EGLSurface local_48;
  EGLSurface surface;
  bool usePlatformExt;
  bool supportsPlatformCreate;
  bool supportsLegacyCreate;
  Library *egl;
  EGLAttrib *attribList_local;
  EGLConfig config_local;
  EGLDisplay display_local;
  NativePixmap *pixmap_local;
  NativeDisplay *nativeDisplay_local;
  eglu *this;
  
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar1);
  CVar2 = NativePixmap::getCapabilities(pixmap);
  bVar9 = (CVar2 & CAPABILITY_CREATE_SURFACE_LEGACY) == 0;
  CVar2 = NativePixmap::getCapabilities(pixmap);
  bVar10 = (CVar2 & CAPABILITY_CREATE_SURFACE_PLATFORM) != 0;
  surface._5_1_ = false;
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && ((!bVar9 || (bVar10))))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      if (bVar10) {
        getClientExtensions_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,this,egl_00);
        local_78._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
        local_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
        std::allocator<char>::allocator();
        legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._6_1_ = 0;
        legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._5_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"EGL_EXT_platform_base",&local_a1);
        bVar10 = de::
                 contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (&local_78,&local_80,&local_a0);
        local_12a = false;
        if (bVar10) {
          local_b0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70);
          local_b8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
          __s = NativeDisplay::getPlatformExtensionName(nativeDisplay);
          std::allocator<char>::allocator();
          legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,__s,
                     (allocator<char> *)
                     ((long)&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
          local_12a = de::
                      contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (&local_b0,&local_b8,&local_d8);
        }
        surface._5_1_ = local_12a;
        if ((legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_d8);
        }
        if ((legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&legacyAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
        }
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
      }
      if (surface._5_1_ == false) {
        if (bVar9) {
          pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar5,"No supported way to create EGL pixmap surface",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0x162);
          __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        toLegacyAttribList((vector<int,_std::allocator<int>_> *)local_110,attribList);
        uVar6 = (**(code **)(*(long *)pixmap + 0x10))();
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_110,0);
        local_48 = (EGLSurface)(**(code **)(*(long *)this + 0x58))(this,display,config,uVar6,pvVar7)
        ;
        dVar4 = (**(code **)(*(long *)this + 0xf8))();
        checkError(dVar4,"eglCreatePixmapSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x15e);
        do {
          dVar3 = ::deGetFalse();
          if ((dVar3 != 0) || (local_48 == (EGLSurface)0x0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"surface != EGL_NO_SURFACE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                       ,0x15f);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_110);
      }
      else {
        toLegacyAttribList((vector<int,_std::allocator<int>_> *)
                           &legacyAttribs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,attribList);
        uVar6 = (**(code **)(*(long *)pixmap + 0x18))();
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &legacyAttribs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0);
        local_48 = (EGLSurface)(**(code **)(*(long *)this + 0x68))(this,display,config,uVar6,pvVar7)
        ;
        dVar4 = (**(code **)(*(long *)this + 0xf8))();
        checkError(dVar4,"eglCreatePlatformPixmapSurfaceEXT()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x157);
        do {
          dVar3 = ::deGetFalse();
          if ((dVar3 != 0) || (local_48 == (EGLSurface)0x0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"surface != EGL_NO_SURFACE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                       ,0x158);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &legacyAttribs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      return local_48;
    }
  }
  pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar5,(char *)0x0,"supportsLegacyCreate || supportsPlatformCreate",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x149);
  __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

EGLSurface createPixmapSurface (NativeDisplay& nativeDisplay, NativePixmap& pixmap, EGLDisplay display, EGLConfig config, const EGLAttrib* attribList)
{
	const Library&	egl							= nativeDisplay.getLibrary();
	const bool		supportsLegacyCreate		= (pixmap.getCapabilities() & NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) != 0;
	const bool		supportsPlatformCreate		= (pixmap.getCapabilities() & NativePixmap::CAPABILITY_CREATE_SURFACE_PLATFORM) != 0;
	bool			usePlatformExt				= false;
	EGLSurface		surface						= EGL_NO_SURFACE;

	TCU_CHECK_INTERNAL(supportsLegacyCreate || supportsPlatformCreate);

	if (supportsPlatformCreate)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(attribList);

		surface = egl.createPlatformPixmapSurfaceEXT(display, config, pixmap.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreatePlatformPixmapSurfaceEXT()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else if (supportsLegacyCreate)
	{
		const vector<EGLint> legacyAttribs = toLegacyAttribList(attribList);
		surface = egl.createPixmapSurface(display, config, pixmap.getLegacyNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreatePixmapSurface()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else
		throw tcu::InternalError("No supported way to create EGL pixmap surface", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(surface != EGL_NO_SURFACE);
	return surface;
}